

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

int32_t __thiscall
fasttext::Dictionary::getLine
          (Dictionary *this,istream *in,vector<int,_std::allocator<int>_> *words,
          vector<int,_std::allocator<int>_> *labels)

{
  __type _Var1;
  uint32_t uVar2;
  int32_t iVar3;
  undefined8 in_RDX;
  string *in_RSI;
  Dictionary *in_RDI;
  Dictionary *unaff_retaddr;
  entry_type type;
  int32_t wid;
  uint32_t h;
  int32_t ntokens;
  string token;
  vector<int,_std::allocator<int>_> word_hashes;
  undefined4 in_stack_ffffffffffffff58;
  int32_t in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  entry_type in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  int in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff84;
  int32_t in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar4;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  Dictionary *in_stack_ffffffffffffffb0;
  Dictionary *line;
  
  line = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1a650e);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffa8);
  iVar4 = 0;
  reset((Dictionary *)
        CONCAT17(in_stack_ffffffffffffff77,
                 CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
        (istream *)in_stack_ffffffffffffff68);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1a6541);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1a654e);
  do {
    in_stack_ffffffffffffff77 =
         readWord(in_RDI,(istream *)
                         CONCAT17(in_stack_ffffffffffffff77,
                                  CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
                  in_stack_ffffffffffffff68);
    if (!(bool)in_stack_ffffffffffffff77) break;
    uVar2 = hash((Dictionary *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (string *)in_RDI);
    iVar3 = getId((Dictionary *)
                  CONCAT17(in_stack_ffffffffffffff77,
                           CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
                  in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    if (iVar3 < 0) {
      in_stack_ffffffffffffff76 =
           getType((Dictionary *)
                   CONCAT17(in_stack_ffffffffffffff77,
                            CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
                   in_stack_ffffffffffffff68);
    }
    else {
      in_stack_ffffffffffffff76 =
           getType((Dictionary *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff5c);
    }
    iVar4 = iVar4 + 1;
    if (in_stack_ffffffffffffff76 == word) {
      addSubwords(unaff_retaddr,(vector<int,_std::allocator<int>_> *)line,in_RSI,
                  (int32_t)((ulong)in_RDX >> 0x20));
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (value_type_conflict *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      in_stack_ffffffffffffff84 = uVar2;
    }
    else if ((in_stack_ffffffffffffff76 == label) && (-1 < iVar3)) {
      in_stack_ffffffffffffff80 = iVar3 - in_RDI->nwords_;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (value_type_conflict *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RDI);
  } while (!_Var1);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1a66b6);
  addWordNgrams(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                (vector<int,_std::allocator<int>_> *)CONCAT44(iVar4,in_stack_ffffffffffffffa0),
                in_stack_ffffffffffffff9c);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)));
  return iVar4;
}

Assistant:

int32_t Dictionary::getLine(
    std::istream& in,
    std::vector<int32_t>& words,
    std::vector<int32_t>& labels) const {
  std::vector<int32_t> word_hashes;
  std::string token;
  int32_t ntokens = 0;

  reset(in);
  words.clear();
  labels.clear();
  while (readWord(in, token)) {
    uint32_t h = hash(token);
    int32_t wid = getId(token, h);
    entry_type type = wid < 0 ? getType(token) : getType(wid);

    ntokens++;
    if (type == entry_type::word) {
      addSubwords(words, token, wid);
      word_hashes.push_back(h);
    } else if (type == entry_type::label && wid >= 0) {
      labels.push_back(wid - nwords_);
    }
    if (token == EOS) {
      break;
    }
  }
  addWordNgrams(words, word_hashes, args_->wordNgrams);
  return ntokens;
}